

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

ErrorList * errorlist_create(MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  ErrorList *__s;
  ErrorList *retval;
  void *d_local;
  MOJOSHADER_free f_local;
  MOJOSHADER_malloc m_local;
  
  __s = (ErrorList *)(*m)(0x48,d);
  if (__s != (ErrorList *)0x0) {
    memset(__s,0,0x48);
    __s->tail = (ErrorItem *)__s;
    __s->m = m;
    __s->f = f;
    __s->d = d;
  }
  return __s;
}

Assistant:

ErrorList *errorlist_create(MOJOSHADER_malloc m, MOJOSHADER_free f, void *d)
{
    ErrorList *retval = (ErrorList *) m(sizeof (ErrorList), d);
    if (retval != NULL)
    {
        memset(retval, '\0', sizeof (ErrorList));
        retval->tail = &retval->head;
        retval->m = m;
        retval->f = f;
        retval->d = d;
    } // if

    return retval;
}